

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::RemoveDigitalSignature(Font *font)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  const_iterator __position;
  bool bVar4;
  
  p_Var1 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar4]) {
    bVar4 = p_Var2[1]._M_color < 0x44534947;
    if (!bVar4) {
      p_Var3 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (__position._M_node = p_Var3, 0x44534947 < p_Var3[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
    ::_M_erase_aux(&(font->tables)._M_t,__position);
    font->num_tables = (uint16_t)(font->tables)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  return true;
}

Assistant:

bool RemoveDigitalSignature(Font* font) {
  std::map<uint32_t, Font::Table>::iterator it =
      font->tables.find(kDsigTableTag);
  if (it != font->tables.end()) {
    font->tables.erase(it);
    font->num_tables = font->tables.size();
  }
  return true;
}